

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

ulong __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::
PerformDefaultAction
          (FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this,
          ArgumentTuple *args,string *call_description)

{
  uint uVar1;
  OnCallSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_00;
  Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_01;
  ulong uVar2;
  runtime_error *this_02;
  string message;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)0x0) {
    this_01 = OnCallSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::GetAction(this_00);
    uVar2 = Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::Perform(this_01,args);
    return uVar2;
  }
  std::operator+(&message,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<BasicTestExpr<0>>::value_ != 0) {
    uVar1 = DefaultValue<BasicTestExpr<0>_>::Get();
    std::__cxx11::string::~string((string *)&message);
    return (ulong)uVar1;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)&message);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }